

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O0

void DIV_PPs(PPC_DFP *dfp)

{
  PPC_DFP *dfp_local;
  
  dfp_set_FPRF_from_FRT(dfp);
  dfp_check_for_OX(dfp);
  dfp_check_for_UX(dfp);
  dfp_check_for_ZX(dfp);
  dfp_check_for_XX(dfp);
  dfp_check_for_VXSNAN(dfp);
  dfp_check_for_VXZDZ(dfp);
  dfp_check_for_VXIDI(dfp);
  return;
}

Assistant:

static void DIV_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_ZX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXZDZ(dfp);
    dfp_check_for_VXIDI(dfp);
}